

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

int Curl_parsenetrc(char *host,char *login,char *password,char *netrcfile)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  __uid_t __uid;
  FILE *__stream;
  char *pcVar7;
  char *pcVar8;
  passwd *ppVar9;
  int iVar10;
  char *__filename;
  char *pcVar11;
  char cVar12;
  int local_17c;
  char *tok_buf;
  char netrcbuffer [256];
  
  cVar1 = *login;
  if (netrcfile == (char *)0x0) {
    pcVar8 = curl_getenv("HOME");
    iVar10 = -1;
    bVar2 = pcVar8 != (char *)0x0;
    __filename = pcVar8;
    if (pcVar8 == (char *)0x0) {
      __uid = geteuid();
      ppVar9 = getpwuid(__uid);
      if (ppVar9 == (passwd *)0x0) {
        return -1;
      }
      __filename = ppVar9->pw_dir;
      if (__filename == (char *)0x0) {
        return -1;
      }
    }
    pcVar7 = curl_maprintf("%s%s%s",__filename,"/",".netrc");
    pcVar11 = __filename;
    if (pcVar7 == (char *)0x0) {
      if (pcVar8 == (char *)0x0) {
        return -1;
      }
      goto LAB_0012101d;
    }
  }
  else {
    bVar2 = false;
    pcVar7 = netrcfile;
    pcVar11 = (char *)0x0;
  }
  __filename = pcVar7;
  __stream = fopen64(__filename,"r");
  if (__stream == (FILE *)0x0) {
    iVar10 = 1;
  }
  else {
    iVar10 = 1;
    cVar12 = '\0';
    bVar3 = false;
    bVar4 = false;
    local_17c = 0;
    bVar5 = false;
    while ((pcVar8 = netrcbuffer, !bVar5 &&
           (pcVar7 = fgets(pcVar8,0x100,__stream), pcVar7 != (char *)0x0))) {
      while( true ) {
        pcVar8 = strtok_r(pcVar8," \t\n",&tok_buf);
        bVar5 = pcVar8 != (char *)0x0;
        if ((pcVar8 == (char *)0x0) || ((*login != '\0' && (*password != '\0')))) break;
        if (cVar12 == '\x02') {
          if (bVar3) {
            if (cVar1 == '\0') {
              strncpy(login,pcVar8,0x3f);
            }
            else {
              local_17c = Curl_raw_equal(login,pcVar8);
            }
            bVar3 = false;
          }
          else {
            if (bVar4) {
              bVar3 = false;
              if (local_17c == 0 && cVar1 != '\0') {
                cVar12 = '\x02';
                bVar4 = false;
                local_17c = 0;
              }
              else {
                strncpy(password,pcVar8,0x3f);
                cVar12 = '\x02';
LAB_00120fc4:
                bVar3 = false;
                bVar4 = false;
              }
              goto LAB_00120f36;
            }
            iVar6 = Curl_raw_equal("login",pcVar8);
            if (iVar6 == 0) {
              iVar6 = Curl_raw_equal("password",pcVar8);
              bVar3 = false;
              if (iVar6 == 0) {
                iVar6 = Curl_raw_equal("machine",pcVar8);
                if (iVar6 != 0) {
                  local_17c = 0;
                }
                cVar12 = (iVar6 == 0) + '\x01';
                goto LAB_00120fc4;
              }
              bVar4 = true;
            }
            else {
              bVar3 = true;
              bVar4 = false;
            }
          }
          cVar12 = '\x02';
        }
        else if (cVar12 == '\x01') {
          iVar6 = Curl_raw_equal(host,pcVar8);
          if (iVar6 != 0) {
            iVar10 = 0;
          }
          cVar12 = (iVar6 != 0) * '\x02';
        }
        else {
          iVar6 = Curl_raw_equal("machine",pcVar8);
          cVar12 = iVar6 != 0;
        }
LAB_00120f36:
        pcVar8 = (char *)0x0;
      }
    }
    fclose(__stream);
  }
  if (bVar2) {
    (*Curl_cfree)(pcVar11);
  }
  if (netrcfile != (char *)0x0) {
    return iVar10;
  }
LAB_0012101d:
  (*Curl_cfree)(__filename);
  return iVar10;
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char *login,
                    char *password,
                    char *netrcfile)
{
  FILE *file;
  int retcode=1;
  int specific_login = (login[0] != 0);
  char *home = NULL;
  bool home_alloc = FALSE;
  bool netrc_alloc = FALSE;
  enum host_lookup_state state=NOTHING;

  char state_login=0;      /* Found a login keyword */
  char state_password=0;   /* Found a password keyword */
  int state_our_login=FALSE;  /* With specific_login, found *our* login name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw= getpwuid(geteuid());
      if(pw) {
#ifdef __VMS
        home = decc_translate_vms(pw->pw_dir);
#else
        home = pw->pw_dir;
#endif
      }
#endif
    }

    if(!home)
      return -1;

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(!netrcfile) {
      if(home_alloc)
        free(home);
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, "r");
  if(file) {
    char *tok;
    char *tok_buf;
    bool done=FALSE;
    char netrcbuffer[256];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok=strtok_r(netrcbuffer, " \t\n", &tok_buf);
      while(!done && tok) {

        if(login[0] && password[0]) {
          done=TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(Curl_raw_equal("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state=HOSTFOUND;
          }
          break;
        case HOSTFOUND:
          if(Curl_raw_equal(host, tok)) {
            /* and yes, this is our host! */
            state=HOSTVALID;
            retcode=0; /* we did find our host */
          }
          else
            /* not our host */
            state=NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = Curl_raw_equal(login, tok);
            }
            else {
              strncpy(login, tok, LOGINSIZE-1);
            }
            state_login=0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              strncpy(password, tok, PASSWORDSIZE-1);
            }
            state_password=0;
          }
          else if(Curl_raw_equal("login", tok))
            state_login=1;
          else if(Curl_raw_equal("password", tok))
            state_password=1;
          else if(Curl_raw_equal("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    fclose(file);
  }

  if(home_alloc)
    free(home);
  if(netrc_alloc)
    free(netrcfile);

  return retcode;
}